

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::RunAlgorithm
          (DeadReckoningCalculator *this,KFLOAT32 totalTimeSinceReset,WorldCoordinates *PositionOut,
          EulerAngles *OrientationOut)

{
  Vector VStack_88;
  Vector VStack_70;
  undefined1 auStack_58 [32];
  WorldCoordinates WStack_38;
  
  switch(this->m_DRA) {
  case DRM_F_P_W:
    calcDeadReckoningFPW(this,PositionOut,totalTimeSinceReset);
    return;
  case DRM_R_P_W:
    break;
  case DRM_R_V_W:
    if ((float)this->m_f64Magnitude < 1e-05) {
      DATA_TYPE::Vector::operator*(&VStack_70,&this->m_initLinearVelocity,totalTimeSinceReset);
      DATA_TYPE::WorldCoordinates::operator+
                ((WorldCoordinates *)auStack_58,&this->m_initPosition,&VStack_70);
      DATA_TYPE::Vector::operator*
                (&VStack_88,&this->m_initLinearAcceleration,
                 (KFLOAT64)
                 ((double)(float)totalTimeSinceReset * 0.5 * (double)(float)totalTimeSinceReset));
      DATA_TYPE::WorldCoordinates::operator+(&WStack_38,(WorldCoordinates *)auStack_58,&VStack_88);
      PositionOut->m_f64Z = WStack_38.m_f64Z;
      PositionOut->m_f64X = WStack_38.m_f64X;
      PositionOut->m_f64Y = WStack_38.m_f64Y;
      DATA_TYPE::DataTypeBase::~DataTypeBase(&WStack_38.super_DataTypeBase);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&VStack_88.super_DataTypeBase);
      DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)auStack_58);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&VStack_70.super_DataTypeBase);
      return;
    }
    calcDeadReckoningRVW(this,PositionOut,OrientationOut,totalTimeSinceReset);
    return;
  case DRM_F_V_W:
    calcDeadReckoningFVW(this,PositionOut,totalTimeSinceReset);
    return;
  case DRM_F_P_B:
    calcDeadReckoningFPB(this,PositionOut,totalTimeSinceReset);
    return;
  case DRM_R_P_B:
    calcDeadReckoningRPB(this,PositionOut,OrientationOut,totalTimeSinceReset);
    return;
  case DRM_R_V_B:
    calcDeadReckoningRVB(this,PositionOut,OrientationOut,totalTimeSinceReset);
    return;
  case DRM_F_V_B:
    calcDeadReckoningFVB(this,PositionOut,totalTimeSinceReset);
    return;
  default:
    return;
  }
  if ((float)this->m_f64Magnitude < 1e-05) {
    VStack_70.m_f32Z = 2.086469e-39;
    VStack_70._20_4_ = 0;
    DATA_TYPE::Vector::operator*
              ((Vector *)(auStack_58 + 8),&this->m_initLinearVelocity,totalTimeSinceReset);
    VStack_70.m_f32Z = 2.086491e-39;
    VStack_70._20_4_ = 0;
    DATA_TYPE::WorldCoordinates::operator+
              (&WStack_38,&this->m_initPosition,(Vector *)(auStack_58 + 8));
    PositionOut->m_f64Z = WStack_38.m_f64Z;
    PositionOut->m_f64X = WStack_38.m_f64X;
    PositionOut->m_f64Y = WStack_38.m_f64Y;
    VStack_70.m_f32Z = 2.086528e-39;
    VStack_70._20_4_ = 0;
    DATA_TYPE::DataTypeBase::~DataTypeBase(&WStack_38.super_DataTypeBase);
    VStack_70.m_f32Z = 2.086542e-39;
    VStack_70._20_4_ = 0;
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)(auStack_58 + 8));
    return;
  }
  calcDeadReckoningRPW(this,PositionOut,OrientationOut,totalTimeSinceReset);
  return;
}

Assistant:

void DeadReckoningCalculator::RunAlgorithm( const KFLOAT32 totalTimeSinceReset, WorldCoordinates& PositionOut, EulerAngles& OrientationOut )
{
    switch( m_DRA )
    {
    case DRM_F_P_W:
        calcDeadReckoningFPW( PositionOut, totalTimeSinceReset );
        break;

    case DRM_R_P_W:
        if( m_f64Magnitude < MAGIC_EPSILON )
            calcDeadReckoningFPW( PositionOut, totalTimeSinceReset );
        else
            calcDeadReckoningRPW( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_R_V_W:
        if( m_f64Magnitude < MAGIC_EPSILON )
            calcDeadReckoningFVW( PositionOut, totalTimeSinceReset );
        else
            calcDeadReckoningRVW( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_F_V_W:
        calcDeadReckoningFVW( PositionOut, totalTimeSinceReset );
        break;

    case DRM_F_P_B:
        calcDeadReckoningFPB( PositionOut, totalTimeSinceReset );
        break;

    case DRM_R_P_B:
        calcDeadReckoningRPB( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_R_V_B:
        calcDeadReckoningRVB( PositionOut, OrientationOut, totalTimeSinceReset );
        break;

    case DRM_F_V_B:
        calcDeadReckoningFVB( PositionOut, totalTimeSinceReset );
        break;
    }
}